

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O1

Vector * CGSIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                double OmegaPrecond)

{
  bool bVar1;
  double bNorm;
  double dVar2;
  Boolean BVar3;
  LASErrIdType LVar4;
  size_t Dim;
  Vector *pVVar5;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Vector p;
  Vector r_;
  Vector r;
  Vector q;
  Vector u_;
  Vector v_;
  Vector u;
  Vector p_;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  Vector local_1b0;
  Vector local_180;
  Vector local_150;
  Vector local_120;
  Vector local_f0;
  Vector local_c0;
  Vector local_90;
  Vector local_60;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&local_150,"r",Dim,Normal,True);
  V_Constr(&local_180,"r_",Dim,Normal,True);
  V_Constr(&local_1b0,"p",Dim,Normal,True);
  V_Constr(&local_120,"q",Dim,Normal,True);
  V_Constr(&local_90,"u",Dim,Normal,True);
  V_Constr(&local_f0,"u_",Dim,Normal,True);
  V_Constr(&local_c0,"v_",Dim,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar3 = Q_KerDefined(A), BVar3 != False)) {
    V_Constr(&local_60,"p_",Dim,Normal,True);
  }
  LVar4 = LASResult();
  if (LVar4 != LASOK) goto LAB_0010a028;
  bNorm = l2Norm_V(b);
  dVar2 = l1Norm_V(x);
  auVar8._8_4_ = (int)(Dim >> 0x20);
  auVar8._0_8_ = Dim;
  auVar8._12_4_ = 0x45300000;
  pVVar5 = b;
  if (2.2250738585072014e-307 <=
      ABS(dVar2 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
    BVar3 = Q_KerDefined(A);
    if (BVar3 != False) {
      OrthoRightKer_VQ(x,A);
    }
    pVVar5 = Mul_QV(A,x);
    pVVar5 = Sub_VV(b,pVVar5);
  }
  Asgn_VV(&local_150,pVVar5);
  if ((PrecondProc == (PrecondProcType)0x0) && (BVar3 = Q_KerDefined(A), BVar3 == False)) {
    Asgn_VV(&local_180,&local_150);
    dVar2 = l2Norm_V(&local_150);
    BVar3 = RTCResult(0,dVar2,bNorm,CGSIterId);
    if (0 < MaxIter && BVar3 == False) {
      local_1e8 = 0;
      uStack_1e4 = 0;
      iVar6 = 1;
      do {
        dVar2 = Mul_VV(&local_180,&local_150);
        if (ABS(dVar2) < 2.2250738585072014e-307) goto LAB_00109fea;
        if (iVar6 == 1) {
          Asgn_VV(&local_90,&local_150);
          Asgn_VV(&local_1b0,&local_90);
        }
        else {
          dVar7 = dVar2 / (double)CONCAT44(uStack_1e4,local_1e8);
          pVVar5 = Mul_SV(dVar7,&local_120);
          pVVar5 = Add_VV(&local_150,pVVar5);
          Asgn_VV(&local_90,pVVar5);
          pVVar5 = Mul_SV(dVar7,&local_1b0);
          pVVar5 = Add_VV(&local_120,pVVar5);
          pVVar5 = Mul_SV(dVar7,pVVar5);
          pVVar5 = Add_VV(&local_90,pVVar5);
          Asgn_VV(&local_1b0,pVVar5);
        }
        pVVar5 = Mul_QV(A,&local_1b0);
        Asgn_VV(&local_c0,pVVar5);
        dVar7 = Mul_VV(&local_180,&local_c0);
        dVar7 = dVar2 / dVar7;
        pVVar5 = Mul_SV(dVar7,&local_c0);
        pVVar5 = Sub_VV(&local_90,pVVar5);
        Asgn_VV(&local_120,pVVar5);
        pVVar5 = Add_VV(&local_90,&local_120);
        Asgn_VV(&local_f0,pVVar5);
        pVVar5 = Mul_SV(dVar7,&local_f0);
        AddAsgn_VV(x,pVVar5);
        pVVar5 = Mul_QV(A,&local_f0);
        pVVar5 = Mul_SV(dVar7,pVVar5);
        SubAsgn_VV(&local_150,pVVar5);
        dVar7 = l2Norm_V(&local_150);
        BVar3 = RTCResult(iVar6,dVar7,bNorm,CGSIterId);
        if (BVar3 != False) break;
        local_1e8 = SUB84(dVar2,0);
        uStack_1e4 = (undefined4)((ulong)dVar2 >> 0x20);
        bVar1 = iVar6 < MaxIter;
        iVar6 = iVar6 + 1;
      } while (bVar1);
    }
  }
  else {
    Asgn_VV(&local_180,&local_150);
    dVar2 = l2Norm_V(&local_150);
    BVar3 = RTCResult(0,dVar2,bNorm,CGSIterId);
    if (0 < MaxIter && BVar3 == False) {
      local_1f8 = 0;
      uStack_1f4 = 0;
      iVar6 = 1;
      do {
        dVar2 = Mul_VV(&local_180,&local_150);
        if (ABS(dVar2) < 2.2250738585072014e-307) goto LAB_00109fea;
        if (iVar6 == 1) {
          Asgn_VV(&local_90,&local_150);
          pVVar5 = &local_90;
        }
        else {
          dVar7 = dVar2 / (double)CONCAT44(uStack_1f4,local_1f8);
          pVVar5 = Mul_SV(dVar7,&local_120);
          pVVar5 = Add_VV(&local_150,pVVar5);
          Asgn_VV(&local_90,pVVar5);
          pVVar5 = Mul_SV(dVar7,&local_1b0);
          pVVar5 = Add_VV(&local_120,pVVar5);
          pVVar5 = Mul_SV(dVar7,pVVar5);
          pVVar5 = Add_VV(&local_90,pVVar5);
        }
        Asgn_VV(&local_1b0,pVVar5);
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV(&local_60,&local_1b0);
        }
        else {
          (*PrecondProc)(A,&local_60,&local_1b0,OmegaPrecond);
        }
        BVar3 = Q_KerDefined(A);
        if (BVar3 != False) {
          OrthoRightKer_VQ(&local_60,A);
        }
        pVVar5 = Mul_QV(A,&local_60);
        Asgn_VV(&local_c0,pVVar5);
        dVar7 = Mul_VV(&local_180,&local_c0);
        dVar7 = dVar2 / dVar7;
        pVVar5 = Mul_SV(dVar7,&local_c0);
        pVVar5 = Sub_VV(&local_90,pVVar5);
        Asgn_VV(&local_120,pVVar5);
        pVVar5 = Add_VV(&local_90,&local_120);
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV(&local_f0,pVVar5);
        }
        else {
          (*PrecondProc)(A,&local_f0,pVVar5,OmegaPrecond);
        }
        BVar3 = Q_KerDefined(A);
        if (BVar3 != False) {
          OrthoRightKer_VQ(&local_f0,A);
        }
        pVVar5 = Mul_SV(dVar7,&local_f0);
        AddAsgn_VV(x,pVVar5);
        pVVar5 = Mul_QV(A,&local_f0);
        pVVar5 = Mul_SV(dVar7,pVVar5);
        SubAsgn_VV(&local_150,pVVar5);
        dVar7 = l2Norm_V(&local_150);
        BVar3 = RTCResult(iVar6,dVar7,bNorm,CGSIterId);
        if (BVar3 != False) break;
        local_1f8 = SUB84(dVar2,0);
        uStack_1f4 = (undefined4)((ulong)dVar2 >> 0x20);
        bVar1 = iVar6 < MaxIter;
        iVar6 = iVar6 + 1;
      } while (bVar1);
    }
  }
LAB_0010a007:
  BVar3 = Q_KerDefined(A);
  if (BVar3 != False) {
    OrthoRightKer_VQ(x,A);
  }
LAB_0010a028:
  V_Destr(&local_150);
  V_Destr(&local_180);
  V_Destr(&local_1b0);
  V_Destr(&local_120);
  V_Destr(&local_90);
  V_Destr(&local_f0);
  V_Destr(&local_c0);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar3 = Q_KerDefined(A), BVar3 != False)) {
    V_Destr(&local_60);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
LAB_00109fea:
  LASError(LASBreakdownErr,"CGSIter","Rho",(char *)0x0,(char *)0x0);
  goto LAB_0010a007;
}

Assistant:

Vector *CGSIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, r_, p, p_, q, u, u_, v_;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&r_, "r_", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    V_Constr(&u, "u", Dim, Normal, True);
    V_Constr(&u_, "u_", Dim, Normal, True);
    V_Constr(&v_, "v_", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&p_, "p_", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CGS */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGSIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "CGSIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&u, &r);
                    Asgn_VV(&p, &u);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&u, Add_VV(&r, Mul_SV(Beta, &q)));
                    Asgn_VV(&p, Add_VV(&u, Mul_SV(Beta, Add_VV(&q, Mul_SV(Beta, &p)))));
                }
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &p_, &p, OmegaPrecond);
	        else
		    Asgn_VV(&p_, &p);
		if (Q_KerDefined(A))
		    OrthoRightKer_VQ(&p_, A);
                Asgn_VV(&v_, Mul_QV(A, &p_));
                Alpha = Rho / Mul_VV(&r_, &v_);
                Asgn_VV(&q, Sub_VV(&u, Mul_SV(Alpha, &v_)));
	        if (PrecondProc != NULL)
                    (*PrecondProc)(A, &u_, Add_VV(&u, &q), OmegaPrecond);
	        else
		    Asgn_VV(&u_, Add_VV(&u, &q));
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&u_, A);
                AddAsgn_VV(x, Mul_SV(Alpha, &u_));
                SubAsgn_VV(&r, Mul_SV(Alpha, Mul_QV(A, &u_)));
                RhoOld = Rho;
            }
        } else {
            /* plain CGS (p_ = p) */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGSIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r_, &r);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "CGSIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&u, &r);
                    Asgn_VV(&p, &u);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&u, Add_VV(&r, Mul_SV(Beta, &q)));
                    Asgn_VV(&p, Add_VV(&u, Mul_SV(Beta, Add_VV(&q, Mul_SV(Beta, &p)))));
                }
                Asgn_VV(&v_, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&r_, &v_);
                Asgn_VV(&q, Sub_VV(&u, Mul_SV(Alpha, &v_)));
                Asgn_VV(&u_, Add_VV(&u, &q));
                AddAsgn_VV(x, Mul_SV(Alpha, &u_));
                SubAsgn_VV(&r, Mul_SV(Alpha, Mul_QV(A, &u_)));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
      
    V_Destr(&r);
    V_Destr(&r_);
    V_Destr(&p);
    V_Destr(&q);
    V_Destr(&u);
    V_Destr(&u_);
    V_Destr(&v_);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&p_);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}